

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void replaceFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uchar uVar1;
  sqlite3 *psVar2;
  uint uVar3;
  uint n;
  int iVar4;
  int iVar5;
  int iVar6;
  uchar *z;
  uchar *__s2;
  uchar *__src;
  uchar *pOld;
  uchar *puVar7;
  uint uVar8;
  code *xDel;
  int iVar9;
  uint uVar10;
  int iVar11;
  long local_68;
  
  psVar2 = context->pOut->db;
  z = sqlite3_value_text(*argv);
  if (z != (uchar *)0x0) {
    n = sqlite3_value_bytes(*argv);
    __s2 = sqlite3_value_text(argv[1]);
    if (__s2 != (uchar *)0x0) {
      if (*__s2 == '\0') {
        xDel = (_func_void_void_ptr *)0xffffffffffffffff;
LAB_0019ba56:
        sqlite3_result_text(context,(char *)z,n,xDel);
        return;
      }
      iVar4 = sqlite3_value_bytes(argv[1]);
      __src = sqlite3_value_text(argv[2]);
      if (__src != (uchar *)0x0) {
        iVar5 = sqlite3_value_bytes(argv[2]);
        local_68 = (long)(int)(n + 1);
        pOld = (uchar *)contextMalloc(context,local_68);
        if (pOld != (uchar *)0x0) {
          iVar9 = 0;
          iVar11 = 0;
          uVar10 = 0;
          while( true ) {
            if ((int)(n - iVar4) < iVar9) break;
            uVar1 = z[iVar9];
            if ((uVar1 == *__s2) && (iVar6 = bcmp(z + iVar9,__s2,(long)iVar4), iVar6 == 0)) {
              puVar7 = pOld;
              if (iVar4 < iVar5) {
                if ((long)psVar2->aLimit[0] < local_68 + (iVar5 - iVar4) + -1) {
                  sqlite3_result_error_toobig(context);
LAB_0019ba87:
                  sqlite3_free(pOld);
                  return;
                }
                local_68 = local_68 + (iVar5 - iVar4);
                uVar8 = uVar10 + 1;
                uVar3 = uVar8 & uVar10;
                uVar10 = uVar8;
                if ((uVar3 == 0) &&
                   (puVar7 = (uchar *)sqlite3Realloc(pOld,(long)(int)local_68 + (int)~n + local_68),
                   puVar7 == (uchar *)0x0)) {
                  sqlite3_result_error_nomem(context);
                  goto LAB_0019ba87;
                }
              }
              pOld = puVar7;
              memcpy(pOld + iVar11,__src,(long)iVar5);
              iVar11 = iVar11 + iVar5;
              iVar9 = iVar9 + iVar4 + -1;
            }
            else {
              pOld[iVar11] = uVar1;
              iVar11 = iVar11 + 1;
            }
            iVar9 = iVar9 + 1;
          }
          memcpy(pOld + iVar11,z + iVar9,(long)(int)(n - iVar9));
          n = (n - iVar9) + iVar11;
          pOld[(int)n] = '\0';
          xDel = sqlite3_free;
          z = pOld;
          goto LAB_0019ba56;
        }
      }
    }
  }
  return;
}

Assistant:

static void replaceFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zStr;        /* The input string A */
  const unsigned char *zPattern;    /* The pattern string B */
  const unsigned char *zRep;        /* The replacement string C */
  unsigned char *zOut;              /* The output */
  int nStr;                /* Size of zStr */
  int nPattern;            /* Size of zPattern */
  int nRep;                /* Size of zRep */
  i64 nOut;                /* Maximum size of zOut */
  int loopLimit;           /* Last zStr[] that might match zPattern[] */
  int i, j;                /* Loop counters */
  unsigned cntExpand;      /* Number zOut expansions */
  sqlite3 *db = sqlite3_context_db_handle(context);

  assert( argc==3 );
  UNUSED_PARAMETER(argc);
  zStr = sqlite3_value_text(argv[0]);
  if( zStr==0 ) return;
  nStr = sqlite3_value_bytes(argv[0]);
  assert( zStr==sqlite3_value_text(argv[0]) );  /* No encoding change */
  zPattern = sqlite3_value_text(argv[1]);
  if( zPattern==0 ){
    assert( sqlite3_value_type(argv[1])==SQLITE_NULL
            || sqlite3_context_db_handle(context)->mallocFailed );
    return;
  }
  if( zPattern[0]==0 ){
    assert( sqlite3_value_type(argv[1])!=SQLITE_NULL );
    sqlite3_result_text(context, (const char*)zStr, nStr, SQLITE_TRANSIENT);
    return;
  }
  nPattern = sqlite3_value_bytes(argv[1]);
  assert( zPattern==sqlite3_value_text(argv[1]) );  /* No encoding change */
  zRep = sqlite3_value_text(argv[2]);
  if( zRep==0 ) return;
  nRep = sqlite3_value_bytes(argv[2]);
  assert( zRep==sqlite3_value_text(argv[2]) );
  nOut = nStr + 1;
  assert( nOut<SQLITE_MAX_LENGTH );
  zOut = contextMalloc(context, (i64)nOut);
  if( zOut==0 ){
    return;
  }
  loopLimit = nStr - nPattern;
  cntExpand = 0;
  for(i=j=0; i<=loopLimit; i++){
    if( zStr[i]!=zPattern[0] || memcmp(&zStr[i], zPattern, nPattern) ){
      zOut[j++] = zStr[i];
    }else{
      if( nRep>nPattern ){
        nOut += nRep - nPattern;
        testcase( nOut-1==db->aLimit[SQLITE_LIMIT_LENGTH] );
        testcase( nOut-2==db->aLimit[SQLITE_LIMIT_LENGTH] );
        if( nOut-1>db->aLimit[SQLITE_LIMIT_LENGTH] ){
          sqlite3_result_error_toobig(context);
          sqlite3_free(zOut);
          return;
        }
        cntExpand++;
        if( (cntExpand&(cntExpand-1))==0 ){
          /* Grow the size of the output buffer only on substitutions
          ** whose index is a power of two: 1, 2, 4, 8, 16, 32, ... */
          u8 *zOld;
          zOld = zOut;
          zOut = sqlite3Realloc(zOut, (int)nOut + (nOut - nStr - 1));
          if( zOut==0 ){
            sqlite3_result_error_nomem(context);
            sqlite3_free(zOld);
            return;
          }
        }
      }
      memcpy(&zOut[j], zRep, nRep);
      j += nRep;
      i += nPattern-1;
    }
  }
  assert( j+nStr-i+1<=nOut );
  memcpy(&zOut[j], &zStr[i], nStr-i);
  j += nStr - i;
  assert( j<=nOut );
  zOut[j] = 0;
  sqlite3_result_text(context, (char*)zOut, j, sqlite3_free);
}